

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

Marray<float,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::operator=
          (Marray<float,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
          *expression)

{
  CoordinateOrder CVar1;
  undefined8 expression_00;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  float *pfVar5;
  size_t *psVar6;
  bool *pbVar7;
  CoordinateOrder *pCVar8;
  size_t *psVar9;
  size_t *psVar10;
  ulong local_80;
  size_t j;
  allocator<float> local_61;
  undefined1 local_60 [8];
  Marray<float,_std::allocator<unsigned_long>_> m;
  ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
  *expression_local;
  Marray<float,_std::allocator<unsigned_long>_> *this_local;
  
  m._64_8_ = expression;
  bVar2 = ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Plus<float,float,float>>,float>
          ::overlaps<float,false,std::allocator<unsigned_long>>
                    ((ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Plus<float,float,float>>,float>
                      *)expression,(View<float,_false,_std::allocator<unsigned_long>_> *)this);
  expression_00 = m._64_8_;
  if (bVar2) {
    std::allocator<float>::allocator(&local_61);
    Marray<andres::BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Plus<float,float,float>>,float>
              ((Marray<float,std::allocator<unsigned_long>> *)local_60,
               (ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
                *)expression_00,&local_61);
    std::allocator<float>::~allocator(&local_61);
    Marray<float,_std::allocator<unsigned_long>_>::operator=
              ((Marray<float,_std::allocator<unsigned_long>_> *)this,
               (Marray<float,_std::allocator<unsigned_long>_> *)local_60);
    Marray<float,_std::allocator<unsigned_long>_>::~Marray
              ((Marray<float,_std::allocator<unsigned_long>_> *)local_60);
  }
  else {
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::size
                      ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
    sVar4 = ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
            ::size((ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
                    *)m._64_8_);
    if (sVar3 != sVar4) {
      pfVar5 = *(float **)this;
      sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::size
                        ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
      __gnu_cxx::new_allocator<float>::deallocate
                ((new_allocator<float> *)(this + 0x40),pfVar5,sVar3);
      sVar3 = ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
              ::size((ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
                      *)m._64_8_);
      pfVar5 = __gnu_cxx::new_allocator<float>::allocate
                         ((new_allocator<float> *)(this + 0x40),sVar3,(void *)0x0);
      *(float **)this = pfVar5;
    }
    sVar3 = ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
            ::dimension((ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
                         *)m._64_8_);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),sVar3);
    local_80 = 0;
    while( true ) {
      sVar3 = ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
              ::dimension((ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
                           *)m._64_8_);
      if (sVar3 <= local_80) break;
      sVar3 = ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
              ::shape((ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
                       *)m._64_8_,local_80);
      psVar6 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                         ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),local_80);
      *psVar6 = sVar3;
      local_80 = local_80 + 1;
    }
    sVar3 = ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
            ::size((ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
                    *)m._64_8_);
    psVar6 = marray_detail::Geometry<std::allocator<unsigned_long>_>::size
                       ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
    *psVar6 = sVar3;
    pbVar7 = marray_detail::Geometry<std::allocator<unsigned_long>_>::isSimple
                       ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
    *pbVar7 = true;
    pCVar8 = ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
             ::coordinateOrder((ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>,_float>
                                *)m._64_8_);
    CVar1 = *pCVar8;
    pCVar8 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                       ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
    *pCVar8 = CVar1;
    sVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                      ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
    if (sVar3 != 0) {
      psVar6 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeBegin
                         ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
      psVar9 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeEnd
                         ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
      psVar10 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStridesBegin
                          ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
      pCVar8 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                         ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
      marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>(psVar6,psVar9,psVar10,pCVar8);
      psVar6 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeBegin
                         ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
      psVar9 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeEnd
                         ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
      psVar10 = marray_detail::Geometry<std::allocator<unsigned_long>_>::stridesBegin
                          ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
      pCVar8 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                         ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
      marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>(psVar6,psVar9,psVar10,pCVar8);
    }
    marray_detail::
    operate<andres::marray_detail::Assign<float,float>,float,std::allocator<unsigned_long>,andres::BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Plus<float,float,float>>,float>
              (this,m._64_8_);
  }
  return (Marray<float,_std::allocator<unsigned_long>_> *)this;
}

Assistant:

inline Marray<T, A>&
Marray<T, A>::operator=
(
    const ViewExpression<E, Te>& expression
)
{
    if(expression.overlaps(*this)) {
        Marray<T, A> m(expression); // temporary copy
        (*this) = m; // recursive call
    }
    else {
        // re-allocate memory (if necessary)
        if(this->size() != expression.size()) {
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = dataAllocator_.allocate(expression.size());
        }
        
        // copy geometry
        this->geometry_.resize(expression.dimension());
        for(std::size_t j=0; j<expression.dimension(); ++j) {
            this->geometry_.shape(j) = expression.shape(j);
        }
        this->geometry_.size() = expression.size();
        this->geometry_.isSimple() = true;
        this->geometry_.coordinateOrder() = expression.coordinateOrder();
        if(this->geometry_.dimension() != 0) {
            marray_detail::stridesFromShape(this->geometry_.shapeBegin(), this->geometry_.shapeEnd(),
                this->geometry_.shapeStridesBegin(), this->geometry_.coordinateOrder());
            marray_detail::stridesFromShape(this->geometry_.shapeBegin(), this->geometry_.shapeEnd(),
                this->geometry_.stridesBegin(), this->geometry_.coordinateOrder());
        }
        
        // copy data
        marray_detail::operate(*this, expression, marray_detail::Assign<T, Te>());
    }
    return *this;
}